

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O2

void __thiscall camp::ClassUnrelated::ClassUnrelated(ClassUnrelated *this,ClassUnrelated *param_1)

{
  Error::Error(&this->super_Error,&param_1->super_Error);
  *(undefined ***)&this->super_Error = &PTR__Error_00141498;
  return;
}

Assistant:

class CAMP_API ClassUnrelated : public Error
{
public:

    /**
     * \brief Constructor
     *
     * \param sourceClass Name of the source class
     * \param requestedClass Name of the requested class
     */
    ClassUnrelated(const std::string& sourceClass, const std::string& requestedClass);
}